

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
* __thiscall
OpenMD::HydroIO::parseHydroFile
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
           *__return_storage_ptr__,HydroIO *this,string *f)

{
  _Rb_tree_header *p_Var1;
  ParseErrorCode parseErrorCode;
  pointer pcVar2;
  size_t sVar3;
  double dVar4;
  basic_istream<char,_std::char_traits<char>_> *pbVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  Type pGVar9;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar10;
  HydroProp *this_00;
  IStreamWrapper *pIVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_01;
  IStreamWrapper *local_528;
  string name;
  Vector3d cor;
  string local_4d8 [32];
  Vector<double,_3U> local_4b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
  local_4a0;
  IStreamWrapper isw;
  ifstream ifs;
  int aiStack_338 [122];
  RectMatrix<double,_6U,_6U> local_150;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::ifstream::ifstream(&ifs,(string *)f,_S_in);
  if (*(int *)((long)aiStack_338 + (long)_ifs[-3]) != 0) {
    snprintf(painCave.errMsg,2000,"HydroIO: Cannot open file: %s\n",(f->_M_dataplus)._M_p);
    painCave.isFatal = 1;
    simError();
  }
  iVar7 = std::istream::peek();
  if (iVar7 != -1) {
    rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::
    BasicIStreamWrapper(&isw,(basic_istream<char,_std::char_traits<char>_> *)&ifs);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
    ::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>>
              ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                *)&this->d_,&isw);
    parseErrorCode = (this->d_).parseResult_.code_;
    if (parseErrorCode != kParseErrorNone) {
      pcVar2 = (f->_M_dataplus)._M_p;
      sVar3 = (this->d_).parseResult_.offset_;
      pcVar8 = rapidjson::GetParseError_En(parseErrorCode);
      snprintf(painCave.errMsg,2000,"HydroIO: JSON parse error in file %s\n\tError: %zu : %s\n",
               pcVar2,sVar3,pcVar8);
      painCave.isFatal = 1;
      simError();
    }
    if ((this->d_).
        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        .data_.f.flags != 3) {
      builtin_strncpy(painCave.errMsg,"HydroIO: OpenMD-Hydro should be a single object.\n",0x32);
      painCave.isFatal = 1;
      simError();
    }
    bVar6 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(&(this->d_).
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ,"OpenMD-Hydro");
    if (!bVar6) {
      snprintf(painCave.errMsg,2000,"HydroIO: File %s does not have a OpenMD-Hydro object.\n",
               (f->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
  }
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)&this->d_,"OpenMD-Hydro");
  this_01 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)((ulong)(pGVar9->data_).s.str & 0xffffffffffff);
  pGVar10 = this_01 + (ulong)(pGVar9->data_).s.length * 0x10;
  for (; this_01 != pGVar10; this_01 = this_01 + 0x10) {
    this_00 = (HydroProp *)operator_new(0x280);
    HydroProp::HydroProp(this_00);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    Vector<double,_3U>::Vector(&cor.super_Vector<double,_3U>);
    SquareMatrix<double,_6>::SquareMatrix((SquareMatrix<double,_6> *)&isw);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    operator[]<char_const>(this_01,"name");
    std::__cxx11::string::assign((char *)&name);
    pdVar12 = (double *)&cor;
    for (lVar14 = 0; lVar14 != 0x30; lVar14 = lVar14 + 0x10) {
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_01,"centerOfResistance");
      dVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)(((ulong)(pGVar9->data_).s.str & 0xffffffffffff) + lVar14));
      *pdVar12 = dVar4;
      pdVar12 = pdVar12 + 1;
    }
    local_528 = &isw;
    for (lVar14 = 0; lVar14 != 6; lVar14 = lVar14 + 1) {
      pIVar11 = local_528;
      for (lVar13 = 0; lVar13 != 0x60; lVar13 = lVar13 + 0x10) {
        pGVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(this_01,"resistanceTensor");
        pbVar5 = (basic_istream<char,_std::char_traits<char>_> *)
                 rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetDouble((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)((*(ulong *)(((ulong)(pGVar9->data_).s.str & 0xffffffffffff) + 8 +
                                            lVar14 * 0x10) & 0xffffffffffff) + lVar13));
        pIVar11->stream_ = pbVar5;
        pIVar11 = (IStreamWrapper *)pIVar11->peekBuffer_;
      }
      local_528 = (IStreamWrapper *)&local_528->readCount_;
    }
    std::__cxx11::string::string(local_4d8,(string *)&name);
    std::__cxx11::string::_M_assign((string *)this_00);
    std::__cxx11::string::~string(local_4d8);
    Vector<double,_3U>::Vector(&local_4b8,&cor.super_Vector<double,_3U>);
    HydroProp::setCenterOfResistance(this_00,(Vector3d *)&local_4b8);
    RectMatrix<double,_6U,_6U>::operator=(&local_150,(RectMatrix<double,_6U,_6U> *)&isw);
    HydroProp::setResistanceTensor(this_00,(Mat6x6d *)&local_150);
    std::__cxx11::string::string((string *)&local_4a0,(string *)&name);
    local_4a0.second = this_00;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>>
                *)__return_storage_ptr__,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&name);
  }
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

map<string, HydroProp*> HydroIO::parseHydroFile(const string& f) {
    map<string, HydroProp*> props;

    ifstream ifs(f);

    if (!ifs.good()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HydroIO: Cannot open file: %s\n", f.c_str());
      painCave.isFatal = 1;
      simError();
    }

#if defined(NLOHMANN_JSON)
    json ij = json::parse(ifs);

    auto& entries = ij["OpenMD-Hydro"];

    for (auto& entry : entries) {
      HydroProp* hp = new HydroProp();
      std::string name;
      Vector3d cor;
      Mat6x6d Xi;

      name = entry["name"].get<std::string>();

      for (unsigned int i = 0; i < 3; i++) {
        cor[i] = entry["centerOfResistance"].get<vector<RealType>>()[i];
      }

      for (unsigned int i = 0; i < 6; i++) {
        for (unsigned int j = 0; j < 6; j++) {
          Xi(i, j) =
              entry["resistanceTensor"].get<vector<vector<RealType>>>()[i][j];
        }
      }

      hp->setName(name);
      hp->setCenterOfResistance(cor);
      hp->setResistanceTensor(Xi);
      props.insert(map<string, HydroProp*>::value_type(name, hp));
    }
#elif defined(RAPID_JSON)
    // Parse entire file into memory once, then reuse d_ for subsequent
    // hydroProps.

    if (ifs.peek() != EOF) {
      rapidjson::IStreamWrapper isw(ifs);
      d_.ParseStream(isw);
      if (d_.HasParseError()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "HydroIO: JSON parse error in file %s\n"
                 "\tError: %zu : %s\n",
                 f.c_str(), d_.GetErrorOffset(),
                 rapidjson::GetParseError_En(d_.GetParseError()));
        painCave.isFatal = 1;
        simError();
      }
      if (!d_.IsObject()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "HydroIO: OpenMD-Hydro should be a single object.\n");
        painCave.isFatal = 1;
        simError();
      }
      // OpenMD-Hydro has a single object, but check that it's really
      // OpenMD-Hydro
      if (!d_.HasMember("OpenMD-Hydro")) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "HydroIO: File %s does not have a OpenMD-Hydro object.\n",
                 f.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
    const Value& entries = d_["OpenMD-Hydro"];
    for (auto& entry : entries.GetArray()) {
      HydroProp* hp = new HydroProp();
      std::string name;
      Vector3d cor;
      Mat6x6d Xi;

      name = entry["name"].GetString();

      for (unsigned int i = 0; i < 3; i++) {
        cor[i] = entry["centerOfResistance"][i].GetDouble();
      }

      for (unsigned int i = 0; i < 6; i++) {
        for (unsigned int j = 0; j < 6; j++) {
          Xi(i, j) = entry["resistanceTensor"][i][j].GetDouble();
        }
      }

      hp->setName(name);
      hp->setCenterOfResistance(cor);
      hp->setResistanceTensor(Xi);
      props.insert(map<string, HydroProp*>::value_type(name, hp));
    }
#endif
    return props;
  }